

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O2

void __thiscall PhPacker_Arg_c_Test::~PhPacker_Arg_c_Test(PhPacker_Arg_c_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(PhPacker, Arg_c)
{
   std::string str = PhPacker::pack<signed char>('c', 12);
   signed char result = std::any_cast<signed char>(PhPacker::unpack('c', str));
   signed char expected = 12;
   GTEST_ASSERT_EQ(result, expected);

   str = PhPacker::pack<signed char>('c', -77);
   result = std::any_cast<signed char>(PhPacker::unpack('c', str));
   expected = -77;
   GTEST_ASSERT_EQ(result, expected);
}